

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp_session.cpp
# Opt level: O2

void __thiscall fineftp::FtpSession::handleFtpCommand(FtpSession *this,string *command)

{
  _Alloc_hider _Var1;
  size_type sVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  const_iterator cVar6;
  size_type sVar7;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>
  __l;
  allocator_type local_d0a;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_d09;
  string ftp_command;
  string parameters;
  undefined8 local_cc8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_cc0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cb0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>_>
  command_map;
  _Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_c60;
  _Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_c48;
  _Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_c30;
  _Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_c18;
  _Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_c00;
  _Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_be8;
  _Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_bd0;
  _Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_bb8;
  _Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_ba0;
  _Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_b88;
  _Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_b70;
  _Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_b58;
  _Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_b40;
  _Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_b28;
  _Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_b10;
  _Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_af8;
  _Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_ae0;
  _Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_ac8;
  _Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_ab0;
  _Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_a98;
  _Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_a80;
  _Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_a68;
  _Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_a50;
  _Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_a38;
  _Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_a20;
  _Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_a08;
  _Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_9f0;
  _Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_9d8;
  _Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_9c0;
  _Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_9a8;
  _Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_990;
  _Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_978;
  _Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_960;
  _Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_948;
  _Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_930;
  strand_service *local_918;
  implementation_type psStack_910;
  undefined8 local_908;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_900 [2];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_8f0 [4];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_7f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_7b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_770;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_730;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_6f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_6b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_670;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_630;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_5f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_5b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_570;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_530;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_4f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_4b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_470;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_430;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_3f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_3b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_370;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_330;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_2f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_2b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_270;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_230;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_1f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_1b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_170;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_130;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_70;
  
  ftp_command._M_dataplus._M_p = (pointer)&ftp_command.field_2;
  ftp_command._M_string_length = 0;
  ftp_command.field_2._M_local_buf[0] = '\0';
  parameters._M_dataplus._M_p = (pointer)&parameters.field_2;
  parameters._M_string_length = 0;
  parameters.field_2._M_local_buf[0] = '\0';
  lVar5 = ::std::__cxx11::string::find((char)command,0x20);
  ::std::__cxx11::string::substr((ulong)local_8f0,(ulong)command);
  ::std::__cxx11::string::operator=((string *)&ftp_command,(string *)local_8f0);
  ::std::__cxx11::string::~string((string *)local_8f0);
  sVar2 = ftp_command._M_string_length;
  _Var1 = ftp_command._M_dataplus;
  for (sVar7 = 0; sVar2 != sVar7; sVar7 = sVar7 + 1) {
    iVar4 = toupper((uint)(byte)_Var1._M_p[sVar7]);
    _Var1._M_p[sVar7] = (char)iVar4;
  }
  if (lVar5 != -1) {
    ::std::__cxx11::string::substr((ulong)local_8f0,(ulong)command);
    ::std::__cxx11::string::operator=((string *)&parameters,(string *)local_8f0);
    ::std::__cxx11::string::~string((string *)local_8f0);
  }
  local_c60._M_f = (offset_in_FtpSession_to_subr)handleFtpCommandUSER;
  local_c60._8_8_ = 0;
  local_c60._M_bound_args.super__Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_fineftp::FtpSession_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)this;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[5],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (local_8f0,(char (*) [5])"USER",&local_c60);
  local_930._M_f = (offset_in_FtpSession_to_subr)handleFtpCommandPASS;
  local_930._8_8_ = 0;
  local_930._M_bound_args.super__Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_fineftp::FtpSession_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)this;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[5],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (local_8f0 + 1,(char (*) [5])"PASS",&local_930);
  local_948._M_f = (offset_in_FtpSession_to_subr)handleFtpCommandACCT;
  local_948._8_8_ = 0;
  local_948._M_bound_args.super__Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_fineftp::FtpSession_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)this;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[5],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (local_8f0 + 2,(char (*) [5])"ACCT",&local_948);
  local_960._M_f = (offset_in_FtpSession_to_subr)handleFtpCommandCWD;
  local_960._8_8_ = 0;
  local_960._M_bound_args.super__Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_fineftp::FtpSession_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)this;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[4],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (local_8f0 + 3,(char (*) [4])"CWD",&local_960);
  local_978._M_f = (offset_in_FtpSession_to_subr)handleFtpCommandCDUP;
  local_978._8_8_ = 0;
  local_978._M_bound_args.super__Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_fineftp::FtpSession_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)this;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[5],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_7f0,(char (*) [5])"CDUP",&local_978);
  local_990._M_f = (offset_in_FtpSession_to_subr)handleFtpCommandREIN;
  local_990._8_8_ = 0;
  local_990._M_bound_args.super__Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_fineftp::FtpSession_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)this;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[5],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_7b0,(char (*) [5])"REIN",&local_990);
  local_9a8._M_f = (offset_in_FtpSession_to_subr)handleFtpCommandQUIT;
  local_9a8._8_8_ = 0;
  local_9a8._M_bound_args.super__Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_fineftp::FtpSession_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)this;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[5],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_770,(char (*) [5])"QUIT",&local_9a8);
  local_9c0._M_f = (offset_in_FtpSession_to_subr)handleFtpCommandPORT;
  local_9c0._8_8_ = 0;
  local_9c0._M_bound_args.super__Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_fineftp::FtpSession_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)this;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[5],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_730,(char (*) [5])"PORT",&local_9c0);
  local_9d8._M_f = (offset_in_FtpSession_to_subr)handleFtpCommandPASV;
  local_9d8._8_8_ = 0;
  local_9d8._M_bound_args.super__Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_fineftp::FtpSession_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)this;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[5],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_6f0,(char (*) [5])"PASV",&local_9d8);
  local_9f0._M_f = (offset_in_FtpSession_to_subr)handleFtpCommandTYPE;
  local_9f0._8_8_ = 0;
  local_9f0._M_bound_args.super__Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_fineftp::FtpSession_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)this;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[5],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_6b0,(char (*) [5])"TYPE",&local_9f0);
  local_a08._M_f = (offset_in_FtpSession_to_subr)handleFtpCommandSTRU;
  local_a08._8_8_ = 0;
  local_a08._M_bound_args.super__Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_fineftp::FtpSession_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)this;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[5],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_670,(char (*) [5])"STRU",&local_a08);
  local_a20._M_f = (offset_in_FtpSession_to_subr)handleFtpCommandMODE;
  local_a20._8_8_ = 0;
  local_a20._M_bound_args.super__Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_fineftp::FtpSession_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)this;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[5],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_630,(char (*) [5])"MODE",&local_a20);
  local_a38._M_f = (offset_in_FtpSession_to_subr)handleFtpCommandRETR;
  local_a38._8_8_ = 0;
  local_a38._M_bound_args.super__Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_fineftp::FtpSession_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)this;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[5],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_5f0,(char (*) [5])"RETR",&local_a38);
  local_a50._M_f = (offset_in_FtpSession_to_subr)handleFtpCommandSTOR;
  local_a50._8_8_ = 0;
  local_a50._M_bound_args.super__Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_fineftp::FtpSession_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)this;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[5],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_5b0,(char (*) [5])"STOR",&local_a50);
  local_a68._M_f = (offset_in_FtpSession_to_subr)handleFtpCommandSTOU;
  local_a68._8_8_ = 0;
  local_a68._M_bound_args.super__Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_fineftp::FtpSession_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)this;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[5],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_570,(char (*) [5])"STOU",&local_a68);
  local_a80._M_f = (offset_in_FtpSession_to_subr)handleFtpCommandAPPE;
  local_a80._8_8_ = 0;
  local_a80._M_bound_args.super__Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_fineftp::FtpSession_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)this;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[5],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_530,(char (*) [5])"APPE",&local_a80);
  local_a98._M_f = (offset_in_FtpSession_to_subr)handleFtpCommandALLO;
  local_a98._8_8_ = 0;
  local_a98._M_bound_args.super__Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_fineftp::FtpSession_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)this;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[5],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_4f0,(char (*) [5])"ALLO",&local_a98);
  local_ab0._M_f = (offset_in_FtpSession_to_subr)handleFtpCommandREST;
  local_ab0._8_8_ = 0;
  local_ab0._M_bound_args.super__Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_fineftp::FtpSession_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)this;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[5],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_4b0,(char (*) [5])"REST",&local_ab0);
  local_ac8._M_f = (offset_in_FtpSession_to_subr)handleFtpCommandRNFR;
  local_ac8._8_8_ = 0;
  local_ac8._M_bound_args.super__Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_fineftp::FtpSession_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)this;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[5],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_470,(char (*) [5])"RNFR",&local_ac8);
  local_ae0._M_f = (offset_in_FtpSession_to_subr)handleFtpCommandRNTO;
  local_ae0._8_8_ = 0;
  local_ae0._M_bound_args.super__Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_fineftp::FtpSession_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)this;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[5],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_430,(char (*) [5])"RNTO",&local_ae0);
  local_af8._M_f = (offset_in_FtpSession_to_subr)handleFtpCommandABOR;
  local_af8._8_8_ = 0;
  local_af8._M_bound_args.super__Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_fineftp::FtpSession_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)this;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[5],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_3f0,(char (*) [5])"ABOR",&local_af8);
  local_b10._M_f = (offset_in_FtpSession_to_subr)handleFtpCommandDELE;
  local_b10._8_8_ = 0;
  local_b10._M_bound_args.super__Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_fineftp::FtpSession_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)this;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[5],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_3b0,(char (*) [5])"DELE",&local_b10);
  local_b28._M_f = (offset_in_FtpSession_to_subr)handleFtpCommandRMD;
  local_b28._8_8_ = 0;
  local_b28._M_bound_args.super__Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_fineftp::FtpSession_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)this;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[4],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_370,(char (*) [4])"RMD",&local_b28);
  local_b40._M_f = (offset_in_FtpSession_to_subr)handleFtpCommandMKD;
  local_b40._8_8_ = 0;
  local_b40._M_bound_args.super__Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_fineftp::FtpSession_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)this;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[4],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_330,(char (*) [4])"MKD",&local_b40);
  local_b58._M_f = (offset_in_FtpSession_to_subr)handleFtpCommandPWD;
  local_b58._8_8_ = 0;
  local_b58._M_bound_args.super__Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_fineftp::FtpSession_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)this;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[4],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_2f0,(char (*) [4])"PWD",&local_b58);
  local_b70._M_f = (offset_in_FtpSession_to_subr)handleFtpCommandLIST;
  local_b70._8_8_ = 0;
  local_b70._M_bound_args.super__Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_fineftp::FtpSession_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)this;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[5],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_2b0,(char (*) [5])"LIST",&local_b70);
  local_b88._M_f = (offset_in_FtpSession_to_subr)handleFtpCommandNLST;
  local_b88._8_8_ = 0;
  local_b88._M_bound_args.super__Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_fineftp::FtpSession_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)this;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[5],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_270,(char (*) [5])"NLST",&local_b88);
  local_ba0._M_f = (offset_in_FtpSession_to_subr)handleFtpCommandSITE;
  local_ba0._8_8_ = 0;
  local_ba0._M_bound_args.super__Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_fineftp::FtpSession_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)this;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[5],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_230,(char (*) [5])"SITE",&local_ba0);
  local_bb8._M_f = (offset_in_FtpSession_to_subr)handleFtpCommandSYST;
  local_bb8._8_8_ = 0;
  local_bb8._M_bound_args.super__Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_fineftp::FtpSession_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)this;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[5],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_1f0,(char (*) [5])"SYST",&local_bb8);
  local_bd0._M_f = (offset_in_FtpSession_to_subr)handleFtpCommandSTAT;
  local_bd0._8_8_ = 0;
  local_bd0._M_bound_args.super__Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_fineftp::FtpSession_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)this;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[5],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_1b0,(char (*) [5])"STAT",&local_bd0);
  local_be8._M_f = (offset_in_FtpSession_to_subr)handleFtpCommandHELP;
  local_be8._8_8_ = 0;
  local_be8._M_bound_args.super__Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_fineftp::FtpSession_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)this;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[5],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_170,(char (*) [5])"HELP",&local_be8);
  local_c00._M_f = (offset_in_FtpSession_to_subr)handleFtpCommandNOOP;
  local_c00._8_8_ = 0;
  local_c00._M_bound_args.super__Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_fineftp::FtpSession_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)this;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[5],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_130,(char (*) [5])"NOOP",&local_c00);
  local_c18._M_f = (offset_in_FtpSession_to_subr)handleFtpCommandFEAT;
  local_c18._8_8_ = 0;
  local_c18._M_bound_args.super__Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_fineftp::FtpSession_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)this;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[5],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_f0,(char (*) [5])"FEAT",&local_c18);
  local_c30._M_f = (offset_in_FtpSession_to_subr)handleFtpCommandOPTS;
  local_c30._8_8_ = 0;
  local_c30._M_bound_args.super__Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_fineftp::FtpSession_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)this;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[5],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_b0,(char (*) [5])"OPTS",&local_c30);
  local_c48._M_f = (offset_in_FtpSession_to_subr)handleFtpCommandSIZE;
  local_c48._8_8_ = 0;
  local_c48._M_bound_args.super__Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_fineftp::FtpSession_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)this;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[5],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_70,(char (*) [5])"SIZE",&local_c48);
  __l._M_len = 0x23;
  __l._M_array = local_8f0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>_>
  ::map(&command_map,__l,&local_d09,&local_d0a);
  lVar5 = 0x880;
  do {
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
             *)((long)&local_8f0[0].first._M_dataplus._M_p + lVar5));
    lVar5 = lVar5 + -0x40;
  } while (lVar5 != -0x40);
  cVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>_>
          ::find(&command_map._M_t,&ftp_command);
  if ((_Rb_tree_header *)cVar6._M_node == &command_map._M_t._M_impl.super__Rb_tree_header) {
    ::std::__cxx11::string::string
              ((string *)local_8f0,"Unrecognized command",(allocator *)&local_c60);
    sendFtpMessage(this,SYNTAX_ERROR_UNRECOGNIZED_COMMAND,&local_8f0[0].first);
    ::std::__cxx11::string::~string((string *)local_8f0);
  }
  else {
    ::std::__cxx11::string::string((string *)&local_cb0,(string *)&parameters);
    std::
    function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
    ::operator()((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                  *)(cVar6._M_node + 2),&local_cb0);
    ::std::__cxx11::string::~string((string *)&local_cb0);
    ::std::__cxx11::string::_M_assign((string *)&this->last_command_);
  }
  bVar3 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &this->last_command_,"QUIT");
  if (bVar3) {
    ::std::__shared_ptr<fineftp::FtpSession,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<fineftp::FtpSession,void>
              ((__shared_ptr<fineftp::FtpSession,(__gnu_cxx::_Lock_policy)2> *)&local_cc8,
               (__weak_ptr<fineftp::FtpSession,_(__gnu_cxx::_Lock_policy)2> *)this);
    local_918 = (this->command_write_strand_).service_;
    psStack_910 = (this->command_write_strand_).impl_;
    local_908 = local_cc8;
    a_Stack_900[0]._M_pi = a_Stack_cc0[0]._M_pi;
    local_cc8 = 0;
    a_Stack_cc0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_900);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_cc0);
  }
  else {
    readFtpCommand(this);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>_>
  ::~_Rb_tree(&command_map._M_t);
  ::std::__cxx11::string::~string((string *)&parameters);
  ::std::__cxx11::string::~string((string *)&ftp_command);
  return;
}

Assistant:

void FtpSession::handleFtpCommand(const std::string& command)
  {
    std::string ftp_command;
    std::string parameters;

    size_t space_index = command.find_first_of(' ');

    ftp_command = command.substr(0, space_index);
    std::transform(ftp_command.begin(), ftp_command.end(), ftp_command.begin(), [](char c) { return static_cast<char>(std::toupper(static_cast<unsigned char>(c))); });

    if (space_index != std::string::npos)
    {
      parameters = command.substr(space_index + 1, std::string::npos);
    }


    const std::map<std::string, std::function<void(std::string)>> command_map {
      // Access control commands
      { "USER", std::bind(&FtpSession::handleFtpCommandUSER, this, std::placeholders::_1) },
      { "PASS", std::bind(&FtpSession::handleFtpCommandPASS, this, std::placeholders::_1) },
      { "ACCT", std::bind(&FtpSession::handleFtpCommandACCT, this, std::placeholders::_1) },
      { "CWD",  std::bind(&FtpSession::handleFtpCommandCWD,  this, std::placeholders::_1) },
      { "CDUP", std::bind(&FtpSession::handleFtpCommandCDUP, this, std::placeholders::_1) },
      { "REIN", std::bind(&FtpSession::handleFtpCommandREIN, this, std::placeholders::_1) },
      { "QUIT", std::bind(&FtpSession::handleFtpCommandQUIT, this, std::placeholders::_1) },

      // Transfer parameter commands
      { "PORT", std::bind(&FtpSession::handleFtpCommandPORT, this, std::placeholders::_1) },
      { "PASV", std::bind(&FtpSession::handleFtpCommandPASV, this, std::placeholders::_1) },
      { "TYPE", std::bind(&FtpSession::handleFtpCommandTYPE, this, std::placeholders::_1) },
      { "STRU", std::bind(&FtpSession::handleFtpCommandSTRU, this, std::placeholders::_1) },
      { "MODE", std::bind(&FtpSession::handleFtpCommandMODE, this, std::placeholders::_1) },

      // Ftp service commands
      { "RETR", std::bind(&FtpSession::handleFtpCommandRETR, this, std::placeholders::_1) },
      { "STOR", std::bind(&FtpSession::handleFtpCommandSTOR, this, std::placeholders::_1) },
      { "STOU", std::bind(&FtpSession::handleFtpCommandSTOU, this, std::placeholders::_1) },
      { "APPE", std::bind(&FtpSession::handleFtpCommandAPPE, this, std::placeholders::_1) },
      { "ALLO", std::bind(&FtpSession::handleFtpCommandALLO, this, std::placeholders::_1) },
      { "REST", std::bind(&FtpSession::handleFtpCommandREST, this, std::placeholders::_1) },
      { "RNFR", std::bind(&FtpSession::handleFtpCommandRNFR, this, std::placeholders::_1) },
      { "RNTO", std::bind(&FtpSession::handleFtpCommandRNTO, this, std::placeholders::_1) },
      { "ABOR", std::bind(&FtpSession::handleFtpCommandABOR, this, std::placeholders::_1) },
      { "DELE", std::bind(&FtpSession::handleFtpCommandDELE, this, std::placeholders::_1) },
      { "RMD",  std::bind(&FtpSession::handleFtpCommandRMD,  this, std::placeholders::_1) },
      { "MKD",  std::bind(&FtpSession::handleFtpCommandMKD,  this, std::placeholders::_1) },
      { "PWD",  std::bind(&FtpSession::handleFtpCommandPWD,  this, std::placeholders::_1) },
      { "LIST", std::bind(&FtpSession::handleFtpCommandLIST, this, std::placeholders::_1) },
      { "NLST", std::bind(&FtpSession::handleFtpCommandNLST, this, std::placeholders::_1) },
      { "SITE", std::bind(&FtpSession::handleFtpCommandSITE, this, std::placeholders::_1) },
      { "SYST", std::bind(&FtpSession::handleFtpCommandSYST, this, std::placeholders::_1) },
      { "STAT", std::bind(&FtpSession::handleFtpCommandSTAT, this, std::placeholders::_1) },
      { "HELP", std::bind(&FtpSession::handleFtpCommandHELP, this, std::placeholders::_1) },
      { "NOOP", std::bind(&FtpSession::handleFtpCommandNOOP, this, std::placeholders::_1) },

      // Modern FTP Commands
      { "FEAT", std::bind(&FtpSession::handleFtpCommandFEAT, this, std::placeholders::_1) },
      { "OPTS", std::bind(&FtpSession::handleFtpCommandOPTS, this, std::placeholders::_1) },
      { "SIZE", std::bind(&FtpSession::handleFtpCommandSIZE, this, std::placeholders::_1) },
    };

    auto command_it = command_map.find(ftp_command);
    if (command_it != command_map.end())
    {
      command_it->second(parameters);
      last_command_ = ftp_command;
    }
    else
    {
      sendFtpMessage(FtpReplyCode::SYNTAX_ERROR_UNRECOGNIZED_COMMAND, "Unrecognized command");
    }

    if (last_command_ == "QUIT")
    {
      // Close command socket
      command_write_strand_.wrap([me = shared_from_this()]() { me->command_socket_.close();  });
    }
    else
    {
      // Wait for next command
      readFtpCommand();
    }
  }